

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.hpp
# Opt level: O1

MDString * __thiscall
LLVMBC::LLVMContext::
construct<LLVMBC::MDString,LLVMBC::Module*&,std::__cxx11::basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>>>
          (LLVMContext *this,Module **u,
          basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_> *u_1)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_11
  *paVar1;
  Module *module;
  MDString *this_00;
  String local_48;
  
  this_00 = (MDString *)allocate(this,0x30,8);
  if (this_00 != (MDString *)0x0) {
    module = *u;
    local_48._M_dataplus._M_p = (u_1->_M_dataplus)._M_p;
    paVar1 = &u_1->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_11
         *)local_48._M_dataplus._M_p == paVar1) {
      local_48.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
      local_48.field_2._8_8_ = *(undefined8 *)((long)&u_1->field_2 + 8);
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    }
    else {
      local_48.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    }
    local_48._M_string_length = u_1->_M_string_length;
    (u_1->_M_dataplus)._M_p = (pointer)paVar1;
    u_1->_M_string_length = 0;
    (u_1->field_2)._M_local_buf[0] = '\0';
    MDString::MDString(this_00,module,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      ::dxil_spv::free_in_thread(local_48._M_dataplus._M_p);
    }
    append_typed_destructor<LLVMBC::MDString>(this,this_00);
    return this_00;
  }
  std::terminate();
}

Assistant:

T *construct(U &&... u)
	{
		T *mem = static_cast<T *>(allocate(sizeof(T), alignof(T)));
		if (!mem)
			std::terminate();
		T *t = new (mem) T(std::forward<U>(u)...);

		if (!std::is_trivially_destructible<T>::value)
			append_typed_destructor(t);
		return t;
	}